

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O2

group * clipp::operator&(group *__return_storage_ptr__,parameter *a,parameter *b)

{
  group gStack_268;
  parameter local_220;
  parameter local_120;
  
  (a->super_token<clipp::parameter>).blocking_ = true;
  (b->super_token<clipp::parameter>).blocking_ = true;
  parameter::parameter(&local_120,a);
  parameter::parameter(&local_220,b);
  group::group<clipp::parameter>(&gStack_268,&local_120,&local_220);
  gStack_268.scoped_ = true;
  group::group(__return_storage_ptr__,&gStack_268);
  group::~group(&gStack_268);
  parameter::~parameter(&local_220);
  parameter::~parameter(&local_120);
  return __return_storage_ptr__;
}

Assistant:

inline group
operator & (parameter a, parameter b)
{
    a.blocking(true);
    b.blocking(true);
    return group{std::move(a), std::move(b)}.scoped(true);
}